

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O0

void c565_converter(uchar *from,uchar *to,int w,int delta)

{
  uint local_3c;
  uint local_38;
  int b;
  int g;
  int r;
  int td;
  int d;
  unsigned_short *t;
  int delta_local;
  int w_local;
  uchar *to_local;
  uchar *from_local;
  
  if (dir == 0) {
    g = 1;
    r = delta;
    _td = (short *)to;
    to_local = from;
  }
  else {
    to_local = from + (w + -1) * delta;
    _td = (short *)(to + (long)(w + -1) * 2);
    r = -delta;
    g = -1;
  }
  dir = (int)(dir == 0);
  b = ri;
  local_38 = gi;
  local_3c = bi;
  t._4_4_ = w;
  while (t._4_4_ != 0) {
    b = (b & 7U) + (uint)*to_local;
    if (0xff < (uint)b) {
      b = 0xff;
    }
    local_38 = (local_38 & 3) + (uint)to_local[1];
    if (0xff < local_38) {
      local_38 = 0xff;
    }
    local_3c = (local_3c & 7) + (uint)to_local[2];
    if (0xff < local_3c) {
      local_3c = 0xff;
    }
    *_td = (short)((b & 0xf8U) << 8) + (short)((local_38 & 0xfc) << 3) + (short)((int)local_3c >> 3)
    ;
    to_local = to_local + r;
    _td = _td + g;
    t._4_4_ = t._4_4_ + -1;
  }
  ri = b;
  gi = local_38;
  bi = local_3c;
  return;
}

Assistant:

static void c565_converter(const uchar *from, uchar *to, int w, int delta) {
  OUTTYPE *t = (OUTTYPE *)to;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    t = t+(w-1)*OUTSIZE;
    d = -delta;
    td = -OUTSIZE;
  } else {
    dir = 1;
    d = delta;
    td = OUTSIZE;
  }
  int r=ri, g=gi, b=bi;
  for (; w--; from += d, t += td) {
    r = (r&7)+from[0]; if (r>255) r = 255;
    g = (g&3)+from[1]; if (g>255) g = 255;
    b = (b&7)+from[2]; if (b>255) b = 255;
    OUTASSIGN(((r&0xf8)<<8) + ((g&0xfc)<<3) + (b>>3));
  }
  ri = r; gi = g; bi = b;
}